

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int64_t iVar2;
  undefined4 uVar3;
  int *piVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  int64_t *ptr;
  undefined1 (*ptr_00) [16];
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  int64_t iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  int64_t iVar39;
  int64_t iVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  undefined1 auVar50 [16];
  undefined1 auVar49 [16];
  undefined1 auVar55 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  uint local_534;
  long local_520;
  undefined1 local_488 [32];
  undefined1 local_468 [32];
  undefined1 local_3f8 [32];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [32];
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  undefined1 local_338 [32];
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  long local_138;
  long lStack_130;
  long lStack_120;
  undefined1 auVar81 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_table_diag_avx2_256_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar46 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_nw_stats_table_diag_avx2_256_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_table_diag_avx2_256_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  uVar42 = CONCAT44(0,gap);
  if (gap < 0) {
    parasail_nw_stats_table_diag_avx2_256_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_table_diag_avx2_256_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_table_diag_avx2_256_64_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_table_diag_avx2_256_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_table_diag_avx2_256_64_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_007da5bd;
  }
  _s1Len = matrix->length;
LAB_007da5bd:
  iVar18 = matrix->min;
  iVar21 = matrix->max;
  iVar34 = -open;
  uVar44 = 0x8000000000000000 - (long)iVar18;
  if (iVar18 != iVar34 && SBORROW4(iVar18,iVar34) == iVar18 + open < 0) {
    uVar44 = CONCAT44(0,open) | 0x8000000000000000;
  }
  ppVar22 = parasail_result_new_table3(_s1Len,s2Len);
  if (ppVar22 != (parasail_result_t *)0x0) {
    iVar18 = _s1Len + 3;
    ppVar22->flag = ppVar22->flag | 0x4831001;
    ptr = parasail_memalign_int64_t(0x20,(long)iVar18);
    uVar41 = (ulong)(s2Len + 6);
    ptr_00 = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar41);
    ptr_01 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_02 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_03 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_04 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_05 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_06 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_07 = parasail_memalign_int64_t(0x20,uVar41);
    ptr_08 = parasail_memalign_int64_t(0x20,uVar41);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = ptr_03;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = ptr_04;
    auVar57 = vpunpcklqdq_avx(auVar57,auVar62);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = ptr_05;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = ptr_06;
    auVar62 = vpunpcklqdq_avx(auVar49,auVar55);
    auVar49 = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar57;
    auVar55 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = ptr;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = ptr_00;
    auVar57 = vpunpcklqdq_avx(auVar56,auVar63);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = ptr_01;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = ptr_02;
    auVar62 = vpunpcklqdq_avx(auVar64,auVar67);
    auVar57 = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar57;
    auVar62 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62;
    auVar59._0_8_ = -(ulong)(auVar57._0_8_ == 0);
    auVar59._8_8_ = -(ulong)(auVar57._8_8_ == 0);
    auVar59._16_8_ = -(ulong)(auVar62._0_8_ == 0);
    auVar59._24_8_ = -(ulong)(auVar62._8_8_ == 0);
    auVar51._0_8_ = -(ulong)(auVar49._0_8_ == 0);
    auVar51._8_8_ = -(ulong)(auVar49._8_8_ == 0);
    auVar51._16_8_ = -(ulong)(auVar55._0_8_ == 0);
    auVar51._24_8_ = -(ulong)(auVar55._8_8_ == 0);
    auVar51 = vpackssdw_avx2(auVar59,auVar51);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
              (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            SUB321(auVar51 >> 0x7f,0) == '\0') &&
           (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          SUB321(auVar51 >> 0xbf,0) == '\0') &&
         (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar51[0x1f]))
    {
      lVar23 = 0x7ffffffffffffffe - (long)iVar21;
      uVar19 = gap * 4;
      auVar52._4_4_ = 0;
      auVar52._0_4_ = uVar19;
      lVar43 = (long)_s1Len;
      lVar30 = lVar43 + -1;
      uVar41 = uVar46 - 1;
      lVar31 = uVar44 + 1;
      auVar80._8_8_ = lVar31;
      auVar80._0_8_ = lVar31;
      auVar81._16_8_ = lVar31;
      auVar81._0_16_ = auVar80;
      auVar81._24_8_ = lVar31;
      auVar57 = vpinsrd_avx(ZEXT416((uint)-(gap * 3 + open)),iVar34 + gap * -2,1);
      auVar57 = vpinsrd_avx(auVar57,iVar34 - gap,2);
      auVar62 = vpslldq_avx(auVar80,8);
      auVar57 = vpinsrd_avx(auVar57,iVar34,3);
      if (0 < _s1Len) {
        piVar4 = matrix->mapper;
        lVar28 = 0;
        do {
          ptr[lVar28] = (long)piVar4[(byte)_s1[lVar28]];
          lVar28 = lVar28 + 1;
        } while (lVar43 != lVar28);
      }
      uVar20 = s2Len + 3;
      local_534 = _s1Len - 1;
      iVar34 = s2Len + -1;
      auVar52._8_4_ = uVar19;
      auVar52._12_4_ = 0;
      auVar52._16_4_ = uVar19;
      auVar52._20_4_ = 0;
      auVar52._24_4_ = uVar19;
      auVar52._28_4_ = 0;
      auVar53._16_16_ = ZEXT116(1) * auVar62;
      auVar53._0_16_ = ZEXT116(0) * auVar62;
      local_338 = vpmovsxdq_avx2(auVar57);
      iVar21 = _s1Len + 1U;
      if ((int)(_s1Len + 1U) < iVar18) {
        iVar21 = iVar18;
      }
      uVar44 = 0;
      auVar74 = ZEXT864(uVar41);
      memset(ptr + lVar43,0,(ulong)(uint)(~_s1Len + iVar21) * 8 + 8);
      piVar4 = matrix->mapper;
      do {
        *(long *)(ptr_00[1] + uVar44 * 8 + 8) = (long)piVar4[(byte)_s2[uVar44]];
        uVar44 = uVar44 + 1;
      } while (uVar46 != uVar44);
      *ptr_00 = (undefined1  [16])0x0;
      *(undefined8 *)ptr_00[1] = 0;
      uVar19 = s2Len + 1U;
      if ((int)(s2Len + 1U) < (int)uVar20) {
        uVar19 = uVar20;
      }
      memset(ptr_00[1] + uVar46 * 8 + 8,0,(ulong)(~s2Len + uVar19) * 8 + 8);
      lVar24 = vpextrq_avx(local_338._16_16_,1);
      uVar44 = 0;
      lVar28 = lVar24;
      do {
        ptr_01[uVar44 + 3] = lVar28;
        ptr_02[uVar44 + 3] = 0;
        ptr_03[uVar44 + 3] = 0;
        ptr_04[uVar44 + 3] = 0;
        ptr_05[uVar44 + 3] = lVar31;
        ptr_06[uVar44 + 3] = 0;
        ptr_07[uVar44 + 3] = 0;
        ptr_08[uVar44 + 3] = 0;
        uVar44 = uVar44 + 1;
        lVar28 = lVar28 - uVar42;
      } while (uVar46 != uVar44);
      lVar28 = 0;
      do {
        *(undefined8 *)((long)ptr_01 + lVar28) = 0;
        *(undefined8 *)((long)ptr_02 + lVar28) = 0;
        *(undefined8 *)((long)ptr_03 + lVar28) = 0;
        *(undefined8 *)((long)ptr_04 + lVar28) = 0;
        *(undefined8 *)((long)ptr_05 + lVar28) = 0;
        *(undefined8 *)((long)ptr_06 + lVar28) = 0;
        *(undefined8 *)((long)ptr_07 + lVar28) = 0;
        *(undefined8 *)((long)ptr_08 + lVar28) = 0;
        lVar28 = lVar28 + 8;
      } while (lVar28 != 0x18);
      lVar28 = 0;
      do {
        ptr_01[uVar46 + lVar28 + 3] = 0;
        ptr_02[uVar46 + lVar28 + 3] = 0;
        ptr_03[uVar46 + lVar28 + 3] = 0;
        ptr_04[uVar46 + lVar28 + 3] = 0;
        ptr_05[uVar46 + lVar28 + 3] = 0;
        ptr_06[uVar46 + lVar28 + 3] = 0;
        ptr_07[uVar46 + lVar28 + 3] = 0;
        ptr_08[uVar46 + lVar28 + 3] = 0;
        lVar28 = lVar28 + 1;
      } while ((int)lVar28 + s2Len < (int)uVar20);
      ptr_01[2] = 0;
      local_358._8_8_ = lVar23;
      local_358._0_8_ = lVar23;
      local_358._16_8_ = lVar23;
      local_358._24_8_ = lVar23;
      auVar66 = ZEXT3264(auVar81);
      auVar94 = ZEXT3264(auVar81);
      auVar79 = ZEXT3264(auVar81);
      auVar73 = ZEXT3264(auVar81);
      local_378 = auVar81;
      if (0 < _s1Len) {
        piVar4 = matrix->matrix;
        uVar44 = 1;
        if (1 < (int)uVar20) {
          uVar44 = (ulong)uVar20;
        }
        lVar25 = uVar46 * 0x10;
        lVar28 = uVar46 * 4 + -4;
        lVar36 = uVar46 * 0xc + -0xc;
        local_520 = uVar46 * 8 + -8;
        auVar51 = vpmovsxbq_avx2(ZEXT416(0x10203));
        lVar38 = 0;
        auVar73 = ZEXT3264(auVar81);
        auVar79 = ZEXT3264(auVar81);
        auVar94 = ZEXT3264(auVar81);
        auVar66 = ZEXT3264(auVar81);
        uVar32 = 0;
        do {
          uVar26 = uVar32 | 2;
          if (matrix->type == 0) {
            uVar45 = ptr[uVar32];
            iVar39 = ptr[uVar32 + 1];
            iVar35 = ptr[uVar32 + 2];
            iVar40 = ptr[uVar32 + 3];
          }
          else {
            uVar19 = (uint)uVar32;
            uVar20 = local_534;
            if ((long)(uVar32 | 1) < lVar43) {
              uVar20 = uVar19 | 1;
            }
            iVar39 = (int64_t)(int)uVar20;
            uVar20 = uVar19 | 2;
            if (lVar43 <= (long)uVar26) {
              uVar20 = local_534;
            }
            iVar35 = (int64_t)(int)uVar20;
            uVar19 = uVar19 | 3;
            if (lVar43 <= (long)(uVar32 | 3)) {
              uVar19 = local_534;
            }
            iVar40 = (int64_t)(int)uVar19;
            uVar45 = uVar32;
          }
          auVar16 = vpermpd_avx2(*(undefined1 (*) [32])(ptr + uVar32),0x1b);
          lVar29 = (long)matrix->size;
          uVar1 = uVar32 + 4;
          uVar33 = ptr_01[2];
          ptr_01[2] = lVar24 - uVar1 * uVar42;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = lVar24 - uVar32 * uVar42;
          auVar57 = vpslldq_avx(auVar58,8);
          auVar75 = ZEXT1664((undefined1  [16])0x0);
          auVar74._16_16_ = ZEXT116(1) * auVar57;
          auVar74._0_16_ = ZEXT116(0) * auVar57;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar33;
          auVar57 = vpslldq_avx(auVar50,8);
          local_468._16_16_ = ZEXT116(1) * auVar57;
          local_468._0_16_ = ZEXT116(0) * auVar57;
          auVar93 = ZEXT864(0) << 0x40;
          uVar33 = 0;
          auVar61 = ZEXT1664((undefined1  [16])0x0);
          auVar54 = ZEXT1664((undefined1  [16])0x0);
          auVar91 = ZEXT864(0) << 0x40;
          local_3d8 = auVar75._0_32_;
          auVar82 = ZEXT864(0) << 0x40;
          auVar87 = ZEXT1664((undefined1  [16])0x0);
          auVar57 = ZEXT816(0) << 0x40;
          local_318 = ZEXT1632(auVar57);
          auVar59 = auVar81;
          auVar17 = auVar53;
          local_488 = ZEXT1632(auVar57);
          local_3f8 = auVar53;
          local_3b8 = local_3d8;
          local_2f8 = ZEXT1632(auVar57);
          auVar13 = _DAT_009090c0;
          do {
            auVar71 = vpermq_avx2(auVar74._0_32_,0xf9);
            iVar2 = ptr_01[uVar33 + 3];
            auVar76._8_8_ = iVar2;
            auVar76._0_8_ = iVar2;
            auVar76._16_8_ = iVar2;
            auVar76._24_8_ = iVar2;
            auVar14 = vpblendd_avx2(auVar71,auVar76,0xc0);
            auVar59 = vpermq_avx2(auVar59,0xf9);
            lVar5 = *(long *)(ptr_00[1] + uVar33 * 8 + 8);
            auVar77._8_8_ = lVar5;
            auVar77._0_8_ = lVar5;
            auVar77._16_8_ = lVar5;
            auVar77._24_8_ = lVar5;
            auVar59 = vpblendd_avx2(auVar59,auVar77,0xc0);
            local_138 = auVar16._0_8_;
            auVar78._0_8_ = -(ulong)(auVar59._0_8_ == local_138);
            lStack_130 = auVar16._8_8_;
            auVar78._8_8_ = -(ulong)(auVar59._8_8_ == lStack_130);
            auVar78._16_8_ = -(ulong)(auVar59._16_8_ == auVar16._16_8_);
            lStack_120 = auVar16._24_8_;
            auVar78._24_8_ = -(ulong)(auVar59._24_8_ == lStack_120);
            auVar10 = vpsubq_avx2(local_318,auVar78);
            auVar71 = vpermq_avx2(auVar75._0_32_,0xf9);
            iVar2 = ptr_02[uVar33 + 3];
            auVar65._8_8_ = iVar2;
            auVar65._0_8_ = iVar2;
            auVar65._16_8_ = iVar2;
            auVar65._24_8_ = iVar2;
            local_318 = vpblendd_avx2(auVar71,auVar65,0xc0);
            auVar71 = vpermq_avx2(auVar87._0_32_,0xf9);
            iVar2 = ptr_03[uVar33 + 3];
            auVar69._8_8_ = iVar2;
            auVar69._0_8_ = iVar2;
            auVar69._16_8_ = iVar2;
            auVar69._24_8_ = iVar2;
            auVar15 = vpblendd_avx2(auVar71,auVar69,0xc0);
            auVar9._8_4_ = open;
            auVar9._0_8_ = CONCAT44(0,open);
            auVar9._12_4_ = 0;
            auVar9._16_4_ = open;
            auVar9._20_4_ = 0;
            auVar9._24_4_ = open;
            auVar9._28_4_ = 0;
            auVar65 = vpsubq_avx2(auVar74._0_32_,auVar9);
            auVar11._8_4_ = gap;
            auVar11._0_8_ = uVar42;
            auVar11._12_4_ = 0;
            auVar11._16_4_ = gap;
            auVar11._20_4_ = 0;
            auVar11._24_4_ = gap;
            auVar11._28_4_ = 0;
            auVar69 = vpsubq_avx2(local_3f8,auVar11);
            auVar71 = vpcmpgtq_avx2(auVar65,auVar69);
            auVar76 = vblendvpd_avx(local_3d8,auVar75._0_32_,auVar71);
            auVar77 = vblendvpd_avx(local_3b8,auVar87._0_32_,auVar71);
            auVar78 = vblendvpd_avx(auVar69,auVar65,auVar71);
            auVar8 = vblendvpd_avx(auVar91._0_32_,auVar82._0_32_,auVar71);
            auVar71 = vpermpd_avx2(auVar82._0_32_,0xf9);
            iVar2 = ptr_04[uVar33 + 3];
            auVar70._8_8_ = iVar2;
            auVar70._0_8_ = iVar2;
            auVar70._16_8_ = iVar2;
            auVar70._24_8_ = iVar2;
            auVar70 = vblendpd_avx(auVar71,auVar70,8);
            auVar17 = vpermpd_avx2(auVar17,0xf9);
            iVar2 = ptr_05[uVar33 + 3];
            auVar71._8_8_ = iVar2;
            auVar71._0_8_ = iVar2;
            auVar71._16_8_ = iVar2;
            auVar71._24_8_ = iVar2;
            auVar17 = vblendpd_avx(auVar17,auVar71,8);
            auVar71 = vpermpd_avx2(auVar54._0_32_,0xf9);
            iVar2 = ptr_06[uVar33 + 3];
            auVar85._8_8_ = iVar2;
            auVar85._0_8_ = iVar2;
            auVar85._16_8_ = iVar2;
            auVar85._24_8_ = iVar2;
            auVar71 = vblendpd_avx(auVar71,auVar85,8);
            auVar65 = vpermpd_avx2(auVar61._0_32_,0xf9);
            iVar2 = ptr_07[uVar33 + 3];
            auVar89._8_8_ = iVar2;
            auVar89._0_8_ = iVar2;
            auVar89._16_8_ = iVar2;
            auVar89._24_8_ = iVar2;
            auVar65 = vblendpd_avx(auVar65,auVar89,8);
            auVar69 = vpermpd_avx2(auVar93._0_32_,0xf9);
            iVar2 = ptr_08[uVar33 + 3];
            auVar92._8_8_ = iVar2;
            auVar92._0_8_ = iVar2;
            auVar92._16_8_ = iVar2;
            auVar92._24_8_ = iVar2;
            auVar69 = vblendpd_avx(auVar69,auVar92,8);
            auVar17 = vpsubq_avx2(auVar17,auVar11);
            auVar11 = vpsubq_avx2(auVar14,auVar9);
            auVar72 = vpcmpgtq_avx2(auVar11,auVar17);
            auVar17 = vblendvpd_avx(auVar17,auVar11,auVar72);
            auVar11 = vblendvpd_avx(auVar71,local_318,auVar72);
            auVar9 = vblendvpd_avx(auVar65,auVar15,auVar72);
            auVar71 = vblendvpd_avx(auVar69,auVar70,auVar72);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = (long)piVar4[uVar45 * lVar29 + lVar5];
            auVar83._8_8_ = 0;
            auVar83._0_8_ = (long)piVar4[iVar39 * lVar29 + *(long *)(ptr_00[1] + uVar33 * 8)];
            auVar57 = vpunpcklqdq_avx(auVar83,auVar68);
            auVar84._8_8_ = 0;
            auVar84._0_8_ = (long)piVar4[iVar35 * lVar29 + *(long *)(*ptr_00 + uVar33 * 8 + 8)];
            auVar88._8_8_ = 0;
            auVar88._0_8_ = (long)piVar4[iVar40 * lVar29 + *(long *)(*ptr_00 + uVar33 * 8)];
            auVar62 = vpunpcklqdq_avx(auVar88,auVar84);
            auVar72._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar62;
            auVar72._16_16_ = ZEXT116(1) * auVar57;
            auVar69 = vpaddq_avx2(auVar72,local_468);
            auVar65 = vpcmpgtq_avx2(auVar72,_DAT_00908c40);
            auVar89 = vpsubq_avx2(local_2f8,auVar65);
            auVar65 = vpcmpgtq_avx2(auVar69,auVar78);
            auVar65 = vblendvpd_avx(auVar78,auVar69,auVar65);
            auVar85 = vpcmpgtq_avx2(auVar65,auVar17);
            auVar65 = vblendvpd_avx(auVar17,auVar65,auVar85);
            auVar86._0_8_ = -(ulong)(auVar65._0_8_ == auVar69._0_8_);
            auVar86._8_8_ = -(ulong)(auVar65._8_8_ == auVar69._8_8_);
            auVar86._16_8_ = -(ulong)(auVar65._16_8_ == auVar69._16_8_);
            auVar86._24_8_ = -(ulong)(auVar65._24_8_ == auVar69._24_8_);
            auVar54 = ZEXT3264(auVar11);
            auVar69 = vblendvpd_avx(auVar11,auVar76,auVar85);
            auVar69 = vblendvpd_avx(auVar69,auVar10,auVar86);
            auVar72 = vblendvpd_avx(auVar9,auVar77,auVar85);
            auVar72 = vblendvpd_avx(auVar72,auVar89,auVar86);
            auVar10 = vpcmpeqd_avx2(auVar9,auVar9);
            auVar89 = vpsubq_avx2(local_488,auVar10);
            auVar92 = vpsubq_avx2(auVar71,auVar10);
            auVar12 = vpsubq_avx2(auVar8,auVar10);
            auVar10 = vpcmpeqd_avx2(local_488,local_488);
            auVar71 = vblendvpd_avx(auVar92,auVar12,auVar85);
            auVar8 = vblendvpd_avx(auVar71,auVar89,auVar86);
            auVar90._0_8_ = -(ulong)(auVar13._0_8_ == auVar10._0_8_);
            auVar90._8_8_ = -(ulong)(auVar13._8_8_ == auVar10._8_8_);
            auVar90._16_8_ = -(ulong)(auVar13._16_8_ == auVar10._16_8_);
            auVar90._24_8_ = -(ulong)(auVar13._24_8_ == auVar10._24_8_);
            auVar10 = vblendvpd_avx(auVar65,local_338,auVar90);
            auVar74 = ZEXT3264(auVar10);
            auVar71 = vandnpd_avx(auVar90,auVar69);
            auVar65 = vandnpd_avx(auVar90,auVar72);
            auVar87 = ZEXT3264(auVar65);
            auVar69 = vandnpd_avx(auVar90,auVar8);
            auVar82 = ZEXT3264(auVar69);
            if (3 < uVar33) {
              auVar8 = vpcmpgtq_avx2(auVar10,local_358);
              local_358 = vblendvpd_avx(auVar10,local_358,auVar8);
              auVar8 = vpcmpgtq_avx2(local_378,auVar10);
              auVar8 = vblendvpd_avx(auVar10,local_378,auVar8);
              auVar72 = vpcmpgtq_avx2(auVar8,auVar71);
              auVar8 = vblendvpd_avx(auVar71,auVar8,auVar72);
              auVar72 = vpcmpgtq_avx2(auVar8,auVar65);
              auVar8 = vblendvpd_avx(auVar65,auVar8,auVar72);
              auVar72 = vpcmpgtq_avx2(auVar8,auVar69);
              local_378 = vblendvpd_avx(auVar69,auVar8,auVar72);
            }
            lVar5 = *((ppVar22->field_4).trace)->trace_del_table;
            if (uVar33 < uVar46) {
              uVar3 = vextractps_avx(auVar10._16_16_,2);
              *(undefined4 *)(lVar5 + lVar38 + uVar33 * 4) = uVar3;
            }
            bVar7 = (long)(uVar32 | 1) < lVar43;
            bVar47 = uVar33 - 1 < uVar46;
            if (bVar47 && bVar7) {
              *(int *)(lVar5 + lVar28 + uVar33 * 4) = auVar10._16_4_;
            }
            if (((long)uVar26 < lVar43) && ((long)(uVar33 - 2) < (long)uVar46 && 1 < uVar33)) {
              *(int *)(local_520 + lVar5 + uVar33 * 4) = auVar10._8_4_;
            }
            bVar6 = (long)(uVar32 | 3) < lVar43;
            bVar48 = 2 < uVar33;
            if (bVar48 && bVar6) {
              *(int *)(lVar5 + lVar36 + uVar33 * 4) = auVar10._0_4_;
            }
            lVar5 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 8);
            if (uVar33 < uVar46) {
              uVar3 = vextractps_avx(auVar71._16_16_,2);
              *(undefined4 *)(lVar5 + lVar38 + uVar33 * 4) = uVar3;
            }
            if (bVar47 && bVar7) {
              *(int *)(lVar5 + lVar28 + uVar33 * 4) = auVar71._16_4_;
            }
            if (((long)uVar26 < lVar43) && ((long)(uVar33 - 2) < (long)uVar46 && 1 < uVar33)) {
              *(int *)(local_520 + lVar5 + uVar33 * 4) = auVar71._8_4_;
            }
            if (bVar48 && bVar6) {
              *(int *)(lVar5 + lVar36 + uVar33 * 4) = auVar71._0_4_;
            }
            lVar5 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x10);
            if (uVar33 < uVar46) {
              uVar3 = vextractps_avx(auVar65._16_16_,2);
              *(undefined4 *)(lVar5 + lVar38 + uVar33 * 4) = uVar3;
            }
            if (bVar47 && bVar7) {
              *(int *)(lVar5 + lVar28 + uVar33 * 4) = auVar65._16_4_;
            }
            if (((long)uVar26 < lVar43) && ((long)(uVar33 - 2) < (long)uVar46 && 1 < uVar33)) {
              *(int *)(local_520 + lVar5 + uVar33 * 4) = auVar65._8_4_;
            }
            if (bVar48 && bVar6) {
              *(int *)(lVar5 + lVar36 + uVar33 * 4) = auVar65._0_4_;
            }
            lVar5 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x18);
            if (uVar33 < uVar46) {
              uVar3 = vextractps_avx(auVar69._16_16_,2);
              *(undefined4 *)(lVar5 + lVar38 + uVar33 * 4) = uVar3;
            }
            if (bVar47 && bVar7) {
              *(int *)(lVar5 + lVar28 + uVar33 * 4) = auVar69._16_4_;
            }
            if (((long)uVar26 < lVar43) && ((long)(uVar33 - 2) < (long)uVar46 && 1 < uVar33)) {
              *(int *)(local_520 + lVar5 + uVar33 * 4) = auVar69._8_4_;
            }
            auVar93 = ZEXT3264(auVar92);
            if (bVar48 && bVar6) {
              *(int *)(lVar5 + lVar36 + uVar33 * 4) = auVar69._0_4_;
            }
            auVar60._0_8_ = -(ulong)(auVar13._0_8_ == uVar41);
            auVar60._8_8_ = -(ulong)(auVar13._8_8_ == uVar41);
            auVar60._16_8_ = -(ulong)(auVar13._16_8_ == uVar41);
            auVar60._24_8_ = -(ulong)(auVar13._24_8_ == uVar41);
            auVar8._8_8_ = -(ulong)(auVar51._8_8_ == lVar30);
            auVar8._0_8_ = -(ulong)(auVar51._0_8_ == lVar30);
            auVar8._16_8_ = -(ulong)(auVar51._16_8_ == lVar30);
            auVar8._24_8_ = -(ulong)(auVar51._24_8_ == lVar30);
            auVar72 = vpand_avx2(auVar60,auVar8);
            auVar8 = vblendvpd_avx(auVar66._0_32_,auVar10,auVar72);
            auVar66 = ZEXT3264(auVar8);
            auVar75 = ZEXT3264(auVar71);
            auVar8 = vblendvpd_avx(auVar94._0_32_,auVar71,auVar72);
            auVar94 = ZEXT3264(auVar8);
            auVar8 = vblendvpd_avx(auVar79._0_32_,auVar65,auVar72);
            auVar79 = ZEXT3264(auVar8);
            auVar8 = vblendvpd_avx(auVar73._0_32_,auVar69,auVar72);
            auVar73 = ZEXT3264(auVar8);
            local_3f8 = vblendvpd_avx(auVar78,auVar81,auVar90);
            local_3d8 = vandnpd_avx(auVar90,auVar76);
            local_3b8 = vandnpd_avx(auVar90,auVar77);
            ptr_01[uVar33] = auVar10._0_8_;
            iVar2 = vmovlpd_avx(auVar71._0_16_);
            ptr_02[uVar33] = iVar2;
            ptr_03[uVar33] = auVar65._0_8_;
            ptr_04[uVar33] = auVar69._0_8_;
            iVar2 = vmovlpd_avx(auVar17._0_16_);
            ptr_05[uVar33] = iVar2;
            iVar2 = vmovlpd_avx(auVar11._0_16_);
            ptr_06[uVar33] = iVar2;
            auVar61 = ZEXT3264(auVar9);
            iVar2 = vmovlps_avx(auVar9._0_16_);
            ptr_07[uVar33] = iVar2;
            iVar2 = vmovlpd_avx(auVar92._0_16_);
            ptr_08[uVar33] = iVar2;
            auVar71 = vandnpd_avx(auVar90,auVar12);
            auVar91 = ZEXT3264(auVar71);
            auVar71 = vpcmpeqd_avx2(auVar12,auVar12);
            auVar13 = vpsubq_avx2(auVar13,auVar71);
            uVar33 = uVar33 + 1;
            local_488 = auVar70;
            local_468 = auVar14;
            local_2f8 = auVar15;
          } while (uVar44 != uVar33);
          auVar17._8_8_ = 4;
          auVar17._0_8_ = 4;
          auVar17._16_8_ = 4;
          auVar17._24_8_ = 4;
          auVar51 = vpaddq_avx2(auVar51,auVar17);
          local_338 = vpsubq_avx2(local_338,auVar52);
          lVar38 = lVar38 + lVar25;
          lVar28 = lVar28 + lVar25;
          lVar36 = lVar36 + lVar25;
          local_520 = local_520 + lVar25;
          uVar32 = uVar1;
        } while ((long)uVar1 < lVar43);
      }
      iVar18 = 4;
      lVar30 = lVar31;
      lVar43 = lVar31;
      lVar28 = lVar31;
      do {
        lVar24 = vpextrq_avx(auVar66._16_16_,1);
        if (lVar43 < lVar24) {
          lVar30 = vpextrq_avx(auVar94._16_16_,1);
          lVar31 = vpextrq_avx(auVar79._16_16_,1);
          lVar28 = vpextrq_avx(auVar73._16_16_,1);
          lVar43 = lVar24;
        }
        iVar37 = (int)lVar28;
        iVar21 = (int)lVar31;
        iVar27 = (int)lVar30;
        auVar59 = auVar66._0_32_;
        auVar51 = vperm2i128_avx2(auVar59,auVar59,8);
        auVar51 = vpalignr_avx2(auVar59,auVar51,8);
        auVar66 = ZEXT3264(auVar51);
        auVar59 = auVar94._0_32_;
        auVar51 = vperm2i128_avx2(auVar59,auVar59,8);
        auVar51 = vpalignr_avx2(auVar59,auVar51,8);
        auVar94 = ZEXT3264(auVar51);
        auVar59 = auVar79._0_32_;
        auVar51 = vperm2i128_avx2(auVar59,auVar59,8);
        auVar51 = vpalignr_avx2(auVar59,auVar51,8);
        auVar79 = ZEXT3264(auVar51);
        auVar59 = auVar73._0_32_;
        auVar51 = vperm2i128_avx2(auVar59,auVar59,8);
        auVar51 = vpalignr_avx2(auVar59,auVar51,8);
        auVar73 = ZEXT3264(auVar51);
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      auVar51 = vpcmpgtq_avx2(auVar81,local_358);
      auVar13._8_8_ = lVar23;
      auVar13._0_8_ = lVar23;
      auVar13._16_8_ = lVar23;
      auVar13._24_8_ = lVar23;
      auVar59 = vpcmpgtq_avx2(local_378,auVar13);
      auVar51 = vpor_avx2(auVar59,auVar51);
      if ((((auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           SUB321(auVar51 >> 0x7f,0) != '\0') || SUB321(auVar51 >> 0xbf,0) != '\0') ||
          auVar51[0x1f] < '\0') {
        *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
        lVar43 = 0;
        iVar27 = 0;
        iVar21 = 0;
        iVar37 = 0;
        iVar34 = 0;
        local_534 = 0;
      }
      ppVar22->score = (int)lVar43;
      ppVar22->end_query = local_534;
      ppVar22->end_ref = iVar34;
      ((ppVar22->field_4).stats)->matches = iVar27;
      ((ppVar22->field_4).stats)->similar = iVar21;
      ((ppVar22->field_4).stats)->length = iVar37;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar22;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vNegInf0;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vNegInf0 = _mm256_insert_epi64_rpl(vZero, NEG_LIMIT, 3);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vGapN = _mm256_set1_epi64x_rpl(gap*N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm256_sub_epi64(vILimit, vOne);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm256_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm256_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i vNH = vZero;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vZero;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf0;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf0;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm256_insert_epi64_rpl(vNH, H_pr[-1], 3);
        vWH = _mm256_insert_epi64_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi64(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi64(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
        vIBoundary = _mm256_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
            similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
            length= (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
        }
        vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
        vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
        vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}